

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::lpFactorRowCompatible(HEkk *this,HighsInt expectedNumRow)

{
  uint in_ESI;
  long in_RDI;
  bool bVar1;
  bool consistent_num_row;
  
  bVar1 = *(uint *)(in_RDI + 0x2c30) == in_ESI;
  if (!bVar1) {
    highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kError,
                "HEkk::initialiseSimplexLpBasisAndFactor: LP(%6d, %6d) has factor_num_row = %d\n",
                (ulong)*(uint *)(in_RDI + 0x2198),(ulong)in_ESI,(ulong)*(uint *)(in_RDI + 0x2c30));
  }
  return bVar1;
}

Assistant:

bool HEkk::lpFactorRowCompatible(const HighsInt expectedNumRow) const {
  // Check for LP-HFactor row compatibility
  const bool consistent_num_row =
      this->simplex_nla_.factor_.num_row == expectedNumRow;
  if (!consistent_num_row) {
    highsLogDev(options_->log_options, HighsLogType::kError,
                "HEkk::initialiseSimplexLpBasisAndFactor: LP(%6d, %6d) has "
                "factor_num_row = %d\n",
                (int)this->lp_.num_col_, expectedNumRow,
                (int)this->simplex_nla_.factor_.num_row);
  }
  return consistent_num_row;
}